

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5791a::TSymbolDefinitionCollectingTraverser::
TSymbolDefinitionCollectingTraverser
          (TSymbolDefinitionCollectingTraverser *this,NodeMapping *symbol_definition_mapping,
          AccessChainMapping *accesschain_mapping,ObjectAccesschainSet *precise_objects,
          unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>
          *precise_return_nodes)

{
  unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>
  *precise_return_nodes_local;
  ObjectAccesschainSet *precise_objects_local;
  AccessChainMapping *accesschain_mapping_local;
  NodeMapping *symbol_definition_mapping_local;
  TSymbolDefinitionCollectingTraverser *this_local;
  
  glslang::TIntermTraverser::TIntermTraverser(&this->super_TIntermTraverser,true,false,false,false);
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TSymbolDefinitionCollectingTraverser_013b30b0;
  this->symbol_definition_mapping_ = symbol_definition_mapping;
  this->precise_objects_ = precise_objects;
  this->precise_return_nodes_ = precise_return_nodes;
  std::__cxx11::string::string((string *)&this->current_object_);
  this->accesschain_mapping_ = accesschain_mapping;
  this->current_function_definition_node_ = (TIntermAggregate *)0x0;
  return;
}

Assistant:

TSymbolDefinitionCollectingTraverser::TSymbolDefinitionCollectingTraverser(
    NodeMapping* symbol_definition_mapping, AccessChainMapping* accesschain_mapping,
    ObjectAccesschainSet* precise_objects,
    std::unordered_set<glslang::TIntermBranch*>* precise_return_nodes)
    : TIntermTraverser(true, false, false), symbol_definition_mapping_(*symbol_definition_mapping),
      precise_objects_(*precise_objects), precise_return_nodes_(*precise_return_nodes),
      current_object_(), accesschain_mapping_(*accesschain_mapping),
      current_function_definition_node_(nullptr) {}